

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

TPZVec<TPZEqnArray<double>_> * __thiscall
TPZVec<TPZEqnArray<double>_>::operator=
          (TPZVec<TPZEqnArray<double>_> *this,initializer_list<TPZEqnArray<double>_> *list)

{
  long lVar1;
  iterator pTVar2;
  TPZEqnArray<double> *this_00;
  
  (*this->_vptr_TPZVec[3])(this,list->_M_len);
  pTVar2 = list->_M_array;
  this_00 = this->fStore;
  for (lVar1 = list->_M_len * 0x3290; lVar1 != 0; lVar1 = lVar1 + -0x3290) {
    TPZEqnArray<double>::operator=(this_00,pTVar2);
    pTVar2 = pTVar2 + 1;
    this_00 = this_00 + 1;
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const std::initializer_list<T> &list) {
	Resize(list.size());

	auto it = list.begin();
	auto it_end = list.end();
	auto *aux = fStore;

	for (; it != it_end; it++, aux++)
		*aux = *it;
	return *this;
}